

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O3

tEdge __thiscall MeshLib::Solid::idEdge(Solid *this,int id0,int id1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  Node<MeshLib::Edge> *pNVar3;
  ulong uVar4;
  Edge *pEVar5;
  Edge e;
  Edge local_78;
  
  paVar1 = &local_78.m_string.field_2;
  local_78.m_string._M_string_length = 0;
  local_78.m_string.field_2._M_local_buf[0] = '\0';
  local_78.m_trait = (Trait *)0x0;
  uVar2 = (ulong)(uint)id1;
  if (id0 < id1) {
    uVar2 = (ulong)(uint)id0;
  }
  uVar4 = (ulong)(uint)id1;
  if (id1 < id0) {
    uVar4 = (ulong)(uint)id0;
  }
  local_78.key = (EdgeKey)(uVar2 | uVar4 << 0x20);
  local_78.m_halfedge[0] = (HalfEdge *)0x0;
  local_78.m_halfedge[1] = (HalfEdge *)0x0;
  local_78.m_string._M_dataplus._M_p = (pointer)paVar1;
  pNVar3 = AVL::Node<MeshLib::Edge>::find_node((this->m_edges).root,&local_78);
  if (pNVar3 == (Node<MeshLib::Edge> *)0x0) {
    pEVar5 = (Edge *)0x0;
  }
  else {
    pEVar5 = pNVar3->data;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_string._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.m_string._M_dataplus._M_p);
  }
  return pEVar5;
}

Assistant:

Solid::tEdge Solid::idEdge( int id0, int id1 )
{
	Edge e(id0,id1);
	return  m_edges.find( &e );//insert a new vertex, with id as the key
}